

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsMulti
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *scalingFactorsIndices,int count,double *outSumLogLikelihood)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  int *piVar7;
  double **ppdVar8;
  uint uVar9;
  double *pdVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  double *pdVar18;
  ulong uVar19;
  int iVar20;
  double *pdVar21;
  double *pdVar22;
  long lVar23;
  double weight;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vector<double,_std::allocator<double>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  allocator_type local_109;
  double *local_108;
  ulong local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  int local_dc;
  ulong local_d8;
  BeagleCPUImpl<double,_1,_0> *local_d0;
  double *local_c8;
  ulong local_c0;
  double *local_b8;
  int *local_b0;
  int *local_a8;
  int *local_a0;
  int *local_98;
  int *local_90;
  double *local_88;
  double *local_80;
  ulong local_78;
  long local_70;
  long local_68;
  vector<double,_std::allocator<double>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  local_b0 = parentBufferIndices;
  local_a8 = childBufferIndices;
  local_a0 = probabilityIndices;
  local_98 = categoryWeightsIndices;
  local_90 = stateFrequenciesIndices;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(long)this->kPatternCount,(allocator_type *)&local_60);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)this->kPatternCount,&local_109);
  if (0 < count) {
    local_78 = (ulong)(count - 1);
    uVar19 = (ulong)(uint)count;
    uVar14 = 0;
    local_d8 = uVar19;
    local_d0 = this;
    do {
      local_b8 = this->gPartials[local_b0[uVar14]];
      pdVar18 = this->gTransitionMatrices[local_a0[uVar14]];
      local_c8 = this->gCategoryWeights[local_98[uVar14]];
      local_108 = this->gStateFrequencies[local_90[uVar14]];
      iVar20 = local_a8[uVar14];
      memset(this->integrationTmp,0,(long)this->kStateCount * (long)this->kPatternCount * 8);
      if ((iVar20 < this->kTipCount) && (piVar7 = this->gTipStates[iVar20], piVar7 != (int *)0x0)) {
        local_f0 = (long)this->kCategoryCount;
        if (0 < local_f0) {
          uVar5 = this->kPatternCount;
          uVar9 = this->kStateCount;
          iVar20 = this->kMatrixSize;
          local_f8 = CONCAT44(local_f8._4_4_,iVar20);
          iVar15 = this->kPartialsPaddedStateCount;
          lVar17 = 0;
          iVar11 = 0;
          lVar13 = 0;
          do {
            if (0 < (int)uVar5) {
              auVar26._8_8_ = 0;
              auVar26._0_8_ = local_c8[lVar17];
              pdVar21 = this->integrationTmp;
              iVar6 = this->kTransPaddedStateCount;
              lVar13 = (long)(int)lVar13;
              pdVar10 = local_b8 + lVar13;
              uVar16 = 0;
              iVar12 = 0;
              do {
                if (0 < (int)uVar9) {
                  pdVar22 = pdVar18 + (long)iVar11 + (long)piVar7[uVar16];
                  uVar19 = 0;
                  do {
                    auVar1._8_8_ = 0;
                    auVar1._0_8_ = pdVar21[(long)iVar12 + uVar19];
                    auVar30._8_8_ = 0;
                    auVar30._0_8_ = *pdVar22 * pdVar10[uVar19];
                    auVar27 = vfmadd213sd_fma(auVar30,auVar26,auVar1);
                    pdVar21[(long)iVar12 + uVar19] = auVar27._0_8_;
                    uVar19 = uVar19 + 1;
                    pdVar22 = pdVar22 + iVar6;
                  } while (uVar9 != uVar19);
                  iVar12 = iVar12 + (int)uVar19;
                }
                lVar13 = lVar13 + iVar15;
                uVar16 = uVar16 + 1;
                pdVar10 = pdVar10 + iVar15;
                this = local_d0;
                uVar19 = local_d8;
                local_e8 = lVar17;
              } while (uVar16 != uVar5);
            }
            lVar17 = lVar17 + 1;
            iVar11 = iVar11 + iVar20;
          } while (lVar17 != local_f0);
        }
      }
      else {
        local_70 = (long)this->kCategoryCount;
        if (0 < local_70) {
          local_80 = this->gPartials[iVar20];
          uVar5 = this->kStateCount;
          uVar9 = uVar5 + 3;
          if (-1 < (int)uVar5) {
            uVar9 = uVar5;
          }
          iVar20 = this->kPatternCount;
          local_dc = this->kMatrixSize;
          local_f0 = (long)this->kPartialsPaddedStateCount;
          local_88 = local_80 + 2;
          local_f8 = local_f0 * 8;
          local_100 = 0;
          lVar13 = 0;
          lVar17 = 0;
          do {
            if (0 < iVar20) {
              auVar27._8_8_ = 0;
              auVar27._0_8_ = local_c8[lVar13];
              pdVar22 = this->integrationTmp;
              lVar17 = (long)(int)lVar17;
              pdVar10 = local_88 + lVar17;
              pdVar21 = local_80 + lVar17;
              iVar15 = 0;
              lVar23 = 0;
              do {
                if (0 < (int)uVar5) {
                  lVar23 = (long)(int)lVar23;
                  uVar16 = 0;
                  uVar19 = local_100;
                  do {
                    iVar11 = (int)uVar19;
                    if ((int)uVar5 < 4) {
                      uVar19 = 0;
                      auVar31 = ZEXT816(0);
                    }
                    else {
                      auVar31 = ZEXT816(0);
                      uVar19 = 0;
                      do {
                        auVar31 = vfmadd231pd_fma(auVar31,*(undefined1 (*) [16])
                                                           (pdVar18 + (long)iVar11 + uVar19),
                                                  *(undefined1 (*) [16])(pdVar10 + (uVar19 - 2)));
                        auVar31 = vfmadd231pd_fma(auVar31,*(undefined1 (*) [16])
                                                           (pdVar18 + (long)iVar11 + uVar19 + 2),
                                                  *(undefined1 (*) [16])(pdVar10 + uVar19));
                        uVar19 = uVar19 + 4;
                      } while ((long)uVar19 < (long)(int)(uVar9 & 0xfffffffc));
                    }
                    dVar25 = auVar31._0_8_;
                    if ((int)uVar19 < (int)uVar5) {
                      uVar19 = uVar19 & 0xffffffff;
                      auVar26 = auVar31;
                      do {
                        auVar34._8_8_ = 0;
                        auVar34._0_8_ = pdVar18[(long)iVar11 + uVar19];
                        auVar2._8_8_ = 0;
                        auVar2._0_8_ = pdVar21[uVar19];
                        auVar26 = vfmadd231sd_fma(auVar26,auVar34,auVar2);
                        dVar25 = auVar26._0_8_;
                        uVar19 = uVar19 + 1;
                      } while (uVar5 != uVar19);
                    }
                    auVar26 = vshufpd_avx(auVar31,auVar31,1);
                    auVar31._8_8_ = 0;
                    auVar31._0_8_ = pdVar22[lVar23];
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = (auVar26._0_8_ + dVar25) * local_b8[lVar17 + uVar16];
                    auVar31 = vfmadd213sd_fma(auVar32,auVar27,auVar31);
                    pdVar22[lVar23] = auVar31._0_8_;
                    lVar23 = lVar23 + 1;
                    uVar16 = uVar16 + 1;
                    uVar19 = (ulong)(iVar11 + uVar5 + 1);
                    local_e8 = lVar17;
                  } while (uVar16 != uVar5);
                }
                lVar17 = lVar17 + local_f0;
                iVar15 = iVar15 + 1;
                pdVar10 = pdVar10 + local_f0;
                pdVar21 = pdVar21 + local_f0;
                this = local_d0;
                uVar19 = local_d8;
                local_68 = lVar13;
              } while (iVar15 != iVar20);
            }
            lVar13 = lVar13 + 1;
            local_100 = (ulong)(uint)((int)local_100 + local_dc);
          } while (lVar13 != local_70);
        }
      }
      local_c0 = uVar14;
      if (0 < this->kPatternCount) {
        lVar13 = 0;
        iVar20 = 0;
        pdVar18 = local_108;
        do {
          iVar15 = this->kStateCount;
          if ((long)iVar15 < 1) {
            dVar25 = 0.0;
          }
          else {
            auVar27 = ZEXT816(0);
            lVar17 = 0;
            do {
              auVar28._8_8_ = 0;
              auVar28._0_8_ = pdVar18[lVar17];
              auVar3._8_8_ = 0;
              auVar3._0_8_ = this->integrationTmp[iVar20 + lVar17];
              auVar27 = vfmadd231sd_fma(auVar27,auVar28,auVar3);
              dVar25 = auVar27._0_8_;
              lVar17 = lVar17 + 1;
            } while (iVar15 != lVar17);
            iVar20 = iVar20 + iVar15;
          }
          if (*scalingFactorsIndices != -1) {
            ppdVar8 = this->gScaleBuffers;
            pdVar10 = ppdVar8[scalingFactorsIndices[uVar14]];
            if (uVar14 == 0) {
              local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar13] = 0;
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] = pdVar10[lVar13];
              if (count != 1) {
                auVar29 = ZEXT864((ulong)local_60.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[lVar13]);
                uVar16 = 1;
                do {
                  dVar24 = ppdVar8[scalingFactorsIndices[uVar16]][lVar13];
                  if (auVar29._0_8_ < dVar24) {
                    local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13] = (int)uVar16;
                    local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar13] = dVar24;
                    auVar29 = ZEXT864((ulong)dVar24);
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar19 != uVar16);
              }
            }
            if (uVar14 != (uint)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar13]) {
              dVar24 = exp(pdVar10[lVar13] -
                           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar13]);
              dVar25 = dVar25 * dVar24;
              pdVar18 = local_108;
            }
          }
          if (uVar14 == 0) {
            this->outLogLikelihoodsTmp[lVar13] = dVar25;
          }
          else {
            if (uVar14 == local_78) {
              dVar25 = log(dVar25 + this->outLogLikelihoodsTmp[lVar13]);
              pdVar10 = this->outLogLikelihoodsTmp;
              pdVar18 = local_108;
            }
            else {
              pdVar10 = this->outLogLikelihoodsTmp;
              dVar25 = dVar25 + pdVar10[lVar13];
            }
            pdVar10[lVar13] = dVar25;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < this->kPatternCount);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar19);
  }
  if ((*scalingFactorsIndices != -1) && (iVar20 = this->kPatternCount, 0 < (long)iVar20)) {
    pdVar18 = this->outLogLikelihoodsTmp;
    lVar13 = 0;
    do {
      pdVar18[lVar13] =
           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar13] + pdVar18[lVar13];
      lVar13 = lVar13 + 1;
    } while (iVar20 != lVar13);
  }
  *outSumLogLikelihood = 0.0;
  iVar20 = this->kPatternCount;
  if (0 < (long)iVar20) {
    pdVar18 = this->gPatternWeights;
    pdVar10 = this->outLogLikelihoodsTmp;
    auVar29 = ZEXT864((ulong)*outSumLogLikelihood);
    lVar13 = 0;
    do {
      auVar33._8_8_ = 0;
      auVar33._0_8_ = pdVar10[lVar13];
      auVar4._8_8_ = 0;
      auVar4._0_8_ = pdVar18[lVar13];
      auVar27 = vfmadd231sd_fma(auVar29._0_16_,auVar33,auVar4);
      auVar29 = ZEXT1664(auVar27);
      *outSumLogLikelihood = auVar27._0_8_;
      lVar13 = lVar13 + 1;
    } while (iVar20 != lVar13);
  }
  dVar25 = *outSumLogLikelihood;
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (uint)(!NAN(dVar25) && !NAN(dVar25)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsMulti(const int* parentBufferIndices,
                                                                   const int* childBufferIndices,
                                                                   const int* probabilityIndices,
                                                                   const int* categoryWeightsIndices,
                                                                   const int* stateFrequenciesIndices,
                                                                   const int* scalingFactorsIndices,
                                                                   int count,
                                                                   double* outSumLogLikelihood) {

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const REALTYPE* partialsParent = gPartials[parentBufferIndices[subsetIndex]];
        const REALTYPE* transMatrix = gTransitionMatrices[probabilityIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        int childIndex = childBufferIndices[subsetIndex];

        memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = 0; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }
        } else {
            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = 0;
            int stateCountModFour = (kStateCount / 4) * 4;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0;
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {
                    int w = l * kMatrixSize;
                    const REALTYPE* partialsChildPtr = &partialsChild[v];
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJA = 0.0, sumOverJB = 0.0;
                        int j = 0;
                        const REALTYPE* transMatrixPtr = &transMatrix[w];
                        for (; j < stateCountModFour; j += 4) {
                            sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                            sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                            sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                            sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                        }
                        for (; j < kStateCount; j++) {
                            sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                        }
//                        for(int j = 0; j < kStateCount; j++) {
//                            sumOverJ += transMatrix[w] * partialsChild[v + j];
//                            w++;
//                        }
                        integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                        u++;

                        w += kStateCount;

                        // increment for the extra column at the end
                        w += T_PAD;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }

        }
        int u = 0;
        for(int k = 0; k < kPatternCount; k++) {
            REALTYPE sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                u++;
            }

            if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
                int cumulativeScalingFactorIndex;
                cumulativeScalingFactorIndex = scalingFactorsIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        tmpScaleFactor = gScaleBuffers[scalingFactorsIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sumOverI *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }



            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sumOverI;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sumOverI;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sumOverI;
            }

        }

    }

    if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }


    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}